

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O2

bool __thiscall banksia::WbEngine::stop(WbEngine *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *__buf;
  allocator local_31;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"force",&local_31);
  sVar1 = Engine::write((Engine *)this,(int)local_30,__buf,in_RCX);
  std::__cxx11::string::~string(local_30);
  return (bool)(char)sVar1;
}

Assistant:

bool WbEngine::stop()
{
    return write("force");
}